

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

uint32_t __thiscall VmaAllocator_T::CalculateGlobalMemoryTypeBits(VmaAllocator_T *this)

{
  uint32_t uVar1;
  VmaAllocator_T *in_RDI;
  uint32_t memTypeIndex;
  uint32_t memoryTypeBits;
  uint local_10;
  uint32_t local_c;
  
  local_c = 0xffffffff;
  if ((in_RDI->m_UseAmdDeviceCoherentMemory & 1U) == 0) {
    for (local_10 = 0; uVar1 = GetMemoryTypeCount(in_RDI), local_10 < uVar1; local_10 = local_10 + 1
        ) {
      if (((in_RDI->m_MemProps).memoryTypes[local_10].propertyFlags & 0x40) != 0) {
        local_c = (1 << ((byte)local_10 & 0x1f) ^ 0xffffffffU) & local_c;
      }
    }
  }
  return local_c;
}

Assistant:

uint32_t VmaAllocator_T::CalculateGlobalMemoryTypeBits() const
{
    // Make sure memory information is already fetched.
    VMA_ASSERT(GetMemoryTypeCount() > 0);

    uint32_t memoryTypeBits = UINT32_MAX;

    if(!m_UseAmdDeviceCoherentMemory)
    {
        // Exclude memory types that have VK_MEMORY_PROPERTY_DEVICE_COHERENT_BIT_AMD.
        for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
        {
            if((m_MemProps.memoryTypes[memTypeIndex].propertyFlags & VK_MEMORY_PROPERTY_DEVICE_COHERENT_BIT_AMD_COPY) != 0)
            {
                memoryTypeBits &= ~(1u << memTypeIndex);
            }
        }
    }

    return memoryTypeBits;
}